

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall MlmWrap::getCurConnectedClients_abi_cxx11_(MlmWrap *this,mlm_client_t *temp)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  undefined8 uVar2;
  byte bVar3;
  int iVar4;
  undefined8 uVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  undefined8 in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  bool bVar6;
  string curItem;
  char *listItem;
  zmsg_t *msg;
  int tries;
  int rc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *cList;
  network_pimpl *in_stack_ffffffffffffff08;
  value_type *__x;
  undefined1 local_81 [33];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_60;
  zmsg_t *local_58;
  string local_50 [32];
  int local_30;
  int local_20;
  undefined1 local_19;
  undefined8 local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1f5086);
  local_20 = 0;
  bVar3 = mlm_client_connected(local_18);
  if ((bVar3 & 1) == 0) {
    local_30 = 5;
    while( true ) {
      uVar2 = local_18;
      network_pimpl::getEndpoint_abi_cxx11_(in_stack_ffffffffffffff08);
      uVar5 = std::__cxx11::string::c_str();
      local_20 = mlm_client_connect(uVar2,uVar5,1000,"temp");
      bVar6 = false;
      if (local_20 < 0) {
        local_30 = local_30 + -1;
        bVar6 = local_30 != 0;
      }
      std::__cxx11::string::~string(local_50);
      if (!bVar6) break;
      zclock_sleep(100);
    }
  }
  if (local_20 == 0) {
    local_58 = zmsg_new();
    local_20 = mlm_client_sendtox(local_18,"Broker","CLIENTLIST","s",0);
    zmsg_destroy(&local_58);
    local_58 = (zmsg_t *)mlm_client_recv(local_18);
    local_60 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)zmsg_popstr(local_58);
    free(local_60);
    local_60 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0;
    local_60 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)zmsg_popstr(local_58);
    free(local_60);
    local_60 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0;
    this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)zmsg_popstr(local_58);
    local_60 = this_00;
    while (pvVar1 = local_60,
          local_60 !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
      __x = (value_type *)local_81;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_81 + 1),(char *)pvVar1,(allocator *)__x);
      std::allocator<char>::~allocator((allocator<char> *)local_81);
      iVar4 = strcmp((char *)local_60,"Broker");
      if ((iVar4 != 0) && (iVar4 = strcmp((char *)local_60,"temp"), iVar4 != 0)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(this_00,__x);
      }
      free(local_60);
      local_60 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0;
      local_60 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)zmsg_popstr(local_58);
      std::__cxx11::string::~string((string *)(local_81 + 1));
    }
    zmsg_destroy(&local_58);
  }
  return in_RDI;
}

Assistant:

std::vector<std::string> MlmWrap::getCurConnectedClients(mlm_client_t *temp) {

    std::vector<std::string> cList; //client list to return
    int rc = 0;

    //put this next part in while loop w/ sleep to constantly try to check until it does
    if(!mlm_client_connected(temp)){
        int tries = 5;
        while((rc = mlm_client_connect(temp, state->getEndpoint().c_str(), 1000, TEMP_NETWORK_ID)) < 0 && --tries){
            zclock_sleep(100);
        }
    }

    if (rc == 0) {
        zmsg_t* msg = zmsg_new();
        rc = mlm_client_sendtox(temp, BROKER_NETWORK_ID, clientlist, "s", NULL);
        zmsg_destroy(&msg);

        msg = mlm_client_recv(temp);
        char *listItem = zmsg_popstr(msg); //pull first string off the msg, it's 'm'
        freen(listItem);
        listItem = zmsg_popstr(msg); //pull second string off the msg, it's 'CLIENTLIST'
        freen(listItem);
        listItem = zmsg_popstr(msg);
        while (listItem != NULL) {
            std::string curItem = listItem;
            if(!(streq(listItem, BROKER_NETWORK_ID) || streq(listItem, TEMP_NETWORK_ID))){
                cList.push_back(curItem);
            }
            freen(listItem);
            listItem = zmsg_popstr(msg);
        }
        zmsg_destroy(&msg);
    }
    else{

    }
    return(cList);
}